

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeUpper(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int i,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *newUpper,bool scale)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  pointer pnVar4;
  int32_t iVar5;
  int iVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  undefined7 in_register_00000009;
  long lVar8;
  uint *puVar9;
  pointer pnVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  undefined4 *puVar13;
  byte bVar14;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  cpp_dec_float<200U,_int,_void> local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar14 = 0;
  if ((int)CONCAT71(in_register_00000009,scale) == 0) {
    pnVar4 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar9 = (uint *)(pnVar4 + i);
    pcVar11 = &local_1b0;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pcVar11->data)._M_elems[0] = *puVar9;
      puVar9 = puVar9 + 1;
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((pcVar11->data)._M_elems + 1);
    }
    local_1b0.exp = pnVar4[i].m_backend.exp;
    local_1b0.neg = pnVar4[i].m_backend.neg;
    local_1b0.fpclass = pnVar4[i].m_backend.fpclass;
    local_1b0.prec_elem = pnVar4[i].m_backend.prec_elem;
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::upperUnscaled((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_1b0,
                    &this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,i);
  }
  if ((((newUpper->m_backend).fpclass != cpp_dec_float_NaN) &&
      (local_1b0.fpclass != cpp_dec_float_NaN)) &&
     (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&newUpper->m_backend,&local_1b0), iVar6 == 0)) {
    return;
  }
  pcVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
  pcVar11 = pcVar7;
  pnVar12 = &this->m_nonbasicValue;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar12->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
    pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar12 + (ulong)bVar14 * -8 + 4);
  }
  (this->m_nonbasicValue).m_backend.exp = pcVar7->exp;
  (this->m_nonbasicValue).m_backend.neg = pcVar7->neg;
  iVar5 = pcVar7->prec_elem;
  (this->m_nonbasicValue).m_backend.fpclass = pcVar7->fpclass;
  (this->m_nonbasicValue).m_backend.prec_elem = iVar5;
  this->m_nonbasicValueUpToDate = false;
  pnVar4 = (this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar10 = pnVar4 + i;
  pcVar11 = &local_1b0;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar11->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
    pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar14 * -2 + 1) * 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar14 * -2 + 1) * 4);
  }
  iVar6 = pnVar4[i].m_backend.exp;
  bVar3 = pnVar4[i].m_backend.neg;
  uVar1 = pnVar4[i].m_backend.fpclass;
  uVar2 = pnVar4[i].m_backend.prec_elem;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::changeUpper(&this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,i,newUpper,scale);
  if (NO_PROBLEM <
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus) {
    pnVar4 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar10 = pnVar4 + i;
    puVar13 = local_b0;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar13 = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar14 * -2 + 1) * 4);
      puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
    }
    local_40 = pnVar4[i].m_backend.exp;
    local_3c = pnVar4[i].m_backend.neg;
    local_38._0_4_ = pnVar4[i].m_backend.fpclass;
    local_38._4_4_ = pnVar4[i].m_backend.prec_elem;
    pcVar11 = &local_1b0;
    puVar9 = local_130;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar9 = (pcVar11->data)._M_elems[0];
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar14 * -2 + 1) * 4);
      puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
    }
    local_b8 = uVar1;
    uStack_b4 = uVar2;
    local_c0 = iVar6;
    local_bc = bVar3;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x6a])(this,i,local_b0,local_130);
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x77])(this);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeUpper(int i, const R& newUpper, bool scale)
{
   if(newUpper != (scale ? this->upperUnscaled(i) : this->upper(i)))
   {
      forceRecompNonbasicValue();

      R oldUpper = this->upper(i);
      SPxLPBase<R>::changeUpper(i, newUpper, scale);

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      {
         changeUpperStatus(i, this->upper(i), oldUpper);
         unInit();
      }
   }
}